

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::VirtualMachine::Add(VirtualMachine *this)

{
  element_type *peVar1;
  VariableType VVar2;
  Variable VVar3;
  Variable VVar4;
  
  VVar3 = popOpStack(this);
  VVar2 = VVar3.type;
  VVar4 = popOpStack(this);
  if (VVar4.type == VVar2) {
    if (VVar2 == Float) {
      pushFloat(this,VVar3.field_1.doubleValue + VVar4.field_1.doubleValue);
      goto LAB_00117649;
    }
    if (VVar2 == Integer) {
      pushInteger(this,(long)&((VVar4.field_1.objectValue)->properties)._M_h._M_buckets +
                       (long)VVar3.field_1.objectValue);
      goto LAB_00117649;
    }
  }
  pushUndefined(this);
LAB_00117649:
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->programCounter = peVar1->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::Add() {
  Variable second = this->popOpStack();
  Variable first = this->popOpStack();

  if (!this->protectDifferentTypes(first, second)) {
    this->advance();
    return;
  }

  if (first.type == VariableType::Integer) {
    this->pushInteger(first.integerValue + second.integerValue);

  } else if (first.type == VariableType::Float) {
    this->pushFloat(first.doubleValue + second.doubleValue);

  } else {
    this->pushUndefined();
  }

  this->advance();
}